

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfile.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  SDL_RWops *pSVar2;
  long lVar3;
  SDL_RWops *pSVar4;
  char *unaff_RBX;
  uint uVar5;
  undefined4 in_register_0000003c;
  char *ctx;
  char test_buf [30];
  
  cleanup((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,0);
  if (pSVar2 == (SDL_RWops *)0x0) {
    pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,"ab+");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x39;
      goto LAB_0010194d;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,"sldfkjsldkfj");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x3b;
      goto LAB_0010194d;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("something","");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x3d;
      goto LAB_0010194d;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("something",0);
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x3f;
      goto LAB_0010194d;
    }
    puts("test1 OK");
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata2","rb");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x48;
      goto LAB_0010194d;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata2","rb+");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x4a;
      goto LAB_0010194d;
    }
    lVar3 = SDL_RWFromFile("sdldata2");
    if (lVar3 == 0) goto LAB_00101956;
    (**(code **)(lVar3 + 0x18))(lVar3);
    unaff_RBX = "sdldata2";
    unlink("sdldata2");
    lVar3 = SDL_RWFromFile("sdldata2");
    if (lVar3 == 0) {
      uVar5 = 0x4f;
      goto LAB_001019ad;
    }
    (**(code **)(lVar3 + 0x18))(lVar3);
    unaff_RBX = "sdldata2";
    unlink("sdldata2");
    lVar3 = SDL_RWFromFile("sdldata2");
    if (lVar3 == 0) {
      uVar5 = 0x52;
      goto LAB_001019ad;
    }
    (**(code **)(lVar3 + 0x18))(lVar3);
    unaff_RBX = "sdldata2";
    unlink("sdldata2");
    lVar3 = SDL_RWFromFile("sdldata2");
    if (lVar3 == 0) {
      uVar5 = 0x55;
      goto LAB_001019ad;
    }
    (**(code **)(lVar3 + 0x18))(lVar3);
    unlink("sdldata2");
    puts("test2 OK");
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1");
    if (pSVar2 == (SDL_RWops *)0x0) {
      uVar5 = 0x5d;
      goto LAB_001019ad;
    }
    iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
    if (iVar1 != 1) {
      uVar5 = 0x5e;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
    if (iVar1 != 10) {
      uVar5 = 0x5f;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
    if (iVar1 != 7) {
      uVar5 = 0x60;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar2->seek)(pSVar2,0,0);
    if (iVar1 != 0) {
      uVar5 = 0x61;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar2->read)(pSVar2,test_buf,1,1);
    if (iVar1 != 0) {
      uVar5 = 0x62;
      goto LAB_001019db;
    }
    (*pSVar2->close)(pSVar2);
    pSVar4 = (SDL_RWops *)SDL_RWFromFile("sdldata1");
    if (pSVar4 == (SDL_RWops *)0x0) {
      uVar5 = 0x66;
      unaff_RBX = (char *)pSVar2;
      goto LAB_001019ad;
    }
    iVar1 = (*pSVar4->seek)(pSVar4,0,0);
    pSVar2 = pSVar4;
    if (iVar1 != 0) {
      uVar5 = 0x67;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->seek)(pSVar4,-7,2);
    if (iVar1 != 0x14) {
      uVar5 = 0x68;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->read)(pSVar4,test_buf,1,7);
    if (iVar1 != 7) {
      uVar5 = 0x69;
      goto LAB_001019db;
    }
    iVar1 = bcmp(test_buf,"1234567",7);
    if (iVar1 != 0) {
      uVar5 = 0x6a;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->read)(pSVar4,test_buf,1,1);
    if (iVar1 != 0) {
      uVar5 = 0x6b;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->read)(pSVar4,test_buf,10,100);
    if (iVar1 != 0) {
      uVar5 = 0x6c;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->seek)(pSVar4,-0x1b,1);
    if (iVar1 != 0) {
      uVar5 = 0x6d;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->read)(pSVar4,test_buf,10,3);
    if (iVar1 != 2) {
      uVar5 = 0x6e;
      goto LAB_001019db;
    }
    iVar1 = bcmp(test_buf,"12345678901234567890",0x14);
    if (iVar1 != 0) {
      uVar5 = 0x6f;
      goto LAB_001019db;
    }
    iVar1 = (*pSVar4->write)(pSVar4,test_buf,1,1);
    if (iVar1 != 0) {
      uVar5 = 0x70;
      goto LAB_001019db;
    }
    (*pSVar4->close)(pSVar4);
    unaff_RBX = (char *)SDL_RWFromFile("sdldata1");
    if ((SDL_RWops *)unaff_RBX == (SDL_RWops *)0x0) {
      uVar5 = 0x75;
      unaff_RBX = (char *)pSVar4;
      goto LAB_001019ad;
    }
    iVar1 = (*((SDL_RWops *)unaff_RBX)->write)((SDL_RWops *)unaff_RBX,"1234567890",10,1);
    if (iVar1 == 1) {
      iVar1 = (*((SDL_RWops *)unaff_RBX)->write)((SDL_RWops *)unaff_RBX,"1234567890",1,10);
      pSVar2 = (SDL_RWops *)unaff_RBX;
      if (iVar1 != 10) {
        uVar5 = 0x77;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->write)((SDL_RWops *)unaff_RBX,"1234567",1,7);
      if (iVar1 != 7) {
        uVar5 = 0x78;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->seek)((SDL_RWops *)unaff_RBX,0,0);
      if (iVar1 != 0) {
        uVar5 = 0x79;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->read)((SDL_RWops *)unaff_RBX,test_buf,1,1);
      if (iVar1 != 1) {
        uVar5 = 0x7a;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->seek)((SDL_RWops *)unaff_RBX,0,0);
      if (iVar1 != 0) {
        uVar5 = 0x7b;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->seek)((SDL_RWops *)unaff_RBX,-7,2);
      if (iVar1 != 0x14) {
        uVar5 = 0x7c;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->read)((SDL_RWops *)unaff_RBX,test_buf,1,7);
      if (iVar1 != 7) {
        uVar5 = 0x7d;
        goto LAB_001019db;
      }
      iVar1 = bcmp(test_buf,"1234567",7);
      if (iVar1 != 0) {
        uVar5 = 0x7e;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->read)((SDL_RWops *)unaff_RBX,test_buf,1,1);
      if (iVar1 != 0) {
        uVar5 = 0x7f;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->read)((SDL_RWops *)unaff_RBX,test_buf,10,100);
      if (iVar1 != 0) goto LAB_001019e3;
      iVar1 = (*((SDL_RWops *)unaff_RBX)->seek)((SDL_RWops *)unaff_RBX,-0x1b,1);
      if (iVar1 != 0) {
        uVar5 = 0x81;
        goto LAB_001019db;
      }
      iVar1 = (*((SDL_RWops *)unaff_RBX)->read)((SDL_RWops *)unaff_RBX,test_buf,10,3);
      if (iVar1 != 2) {
        uVar5 = 0x82;
        goto LAB_001019db;
      }
      iVar1 = bcmp(test_buf,"12345678901234567890",0x14);
      if (iVar1 != 0) {
        uVar5 = 0x83;
        goto LAB_001019db;
      }
      (*((SDL_RWops *)unaff_RBX)->close)((SDL_RWops *)unaff_RBX);
      puts("test3 OK");
      pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1");
      if (pSVar2 == (SDL_RWops *)0x0) {
        uVar5 = 0x89;
      }
      else {
        iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
        if (iVar1 != 1) {
          uVar5 = 0x8a;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
        if (iVar1 != 10) {
          uVar5 = 0x8b;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
        if (iVar1 != 7) {
          uVar5 = 0x8c;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->seek)(pSVar2,0,0);
        if (iVar1 != 0) {
          uVar5 = 0x8d;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->read)(pSVar2,test_buf,1,1);
        if (iVar1 != 1) {
          uVar5 = 0x8e;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->seek)(pSVar2,0,0);
        if (iVar1 != 0) {
          uVar5 = 0x8f;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
        if (iVar1 != 0x14) {
          uVar5 = 0x90;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->read)(pSVar2,test_buf,1,7);
        if (iVar1 != 7) {
          uVar5 = 0x91;
          goto LAB_001019db;
        }
        iVar1 = bcmp(test_buf,"1234567",7);
        if (iVar1 != 0) {
          uVar5 = 0x92;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->read)(pSVar2,test_buf,1,1);
        if (iVar1 != 0) {
          uVar5 = 0x93;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->read)(pSVar2,test_buf,10,100);
        if (iVar1 != 0) {
          uVar5 = 0x94;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
        if (iVar1 != 0) {
          uVar5 = 0x95;
          goto LAB_001019db;
        }
        iVar1 = (*pSVar2->read)(pSVar2,test_buf,10,3);
        if (iVar1 != 2) {
          uVar5 = 0x96;
          goto LAB_001019db;
        }
        iVar1 = bcmp(test_buf,"12345678901234567890",0x14);
        if (iVar1 != 0) {
          uVar5 = 0x97;
          goto LAB_001019db;
        }
        (*pSVar2->close)(pSVar2);
        puts("test4 OK");
        pSVar4 = (SDL_RWops *)SDL_RWFromFile("sdldata1");
        if (pSVar4 != (SDL_RWops *)0x0) {
          iVar1 = (*pSVar4->write)(pSVar4,"1234567890",10,1);
          pSVar2 = pSVar4;
          if (iVar1 == 1) {
            iVar1 = (*pSVar4->write)(pSVar4,"1234567890",1,10);
            if (iVar1 == 10) {
              iVar1 = (*pSVar4->write)(pSVar4,"1234567",1,7);
              if (iVar1 == 7) {
                iVar1 = (*pSVar4->seek)(pSVar4,0,0);
                if (iVar1 == 0) {
                  iVar1 = (*pSVar4->read)(pSVar4,test_buf,1,1);
                  if (iVar1 == 1) {
                    iVar1 = (*pSVar4->seek)(pSVar4,0,0);
                    if (iVar1 == 0) {
                      iVar1 = (*pSVar4->seek)(pSVar4,-7,2);
                      if (iVar1 == 0x2f) {
                        iVar1 = (*pSVar4->read)(pSVar4,test_buf,1,7);
                        if (iVar1 == 7) {
                          iVar1 = bcmp(test_buf,"1234567",7);
                          if (iVar1 == 0) {
                            iVar1 = (*pSVar4->read)(pSVar4,test_buf,1,1);
                            if (iVar1 == 0) {
                              iVar1 = (*pSVar4->read)(pSVar4,test_buf,10,100);
                              if (iVar1 == 0) {
                                iVar1 = (*pSVar4->seek)(pSVar4,-0x1b,1);
                                if (iVar1 == 0x1b) {
                                  iVar1 = (*pSVar4->seek)(pSVar4,0,0);
                                  if (iVar1 == 0) {
                                    iVar1 = (*pSVar4->read)(pSVar4,test_buf,10,3);
                                    if (iVar1 == 3) {
                                      iVar1 = bcmp(test_buf,"123456789012345678901234567123",0x1e);
                                      if (iVar1 == 0) {
                                        (*pSVar4->close)(pSVar4);
                                        ctx = "test5 OK";
                                        puts("test5 OK");
                                        cleanup((EVP_PKEY_CTX *)ctx);
                                        return 0;
                                      }
                                      uVar5 = 0xb1;
                                    }
                                    else {
                                      uVar5 = 0xaf;
                                    }
                                  }
                                  else {
                                    uVar5 = 0xae;
                                  }
                                }
                                else {
                                  uVar5 = 0xac;
                                }
                              }
                              else {
                                uVar5 = 0xaa;
                              }
                            }
                            else {
                              uVar5 = 0xa9;
                            }
                          }
                          else {
                            uVar5 = 0xa8;
                          }
                        }
                        else {
                          uVar5 = 0xa7;
                        }
                      }
                      else {
                        uVar5 = 0xa6;
                      }
                    }
                    else {
                      uVar5 = 0xa4;
                    }
                  }
                  else {
                    uVar5 = 0xa3;
                  }
                }
                else {
                  uVar5 = 0xa1;
                }
              }
              else {
                uVar5 = 0xa0;
              }
            }
            else {
              uVar5 = 0x9f;
            }
          }
          else {
            uVar5 = 0x9e;
          }
          goto LAB_001019db;
        }
        uVar5 = 0x9d;
        unaff_RBX = (char *)pSVar2;
      }
      goto LAB_001019ad;
    }
  }
  else {
    uVar5 = 0x37;
LAB_0010194d:
    rwops_error_quit(uVar5,pSVar2);
LAB_00101956:
    uVar5 = 0x4c;
LAB_001019ad:
    rwops_error_quit(uVar5,(SDL_RWops *)0x0);
  }
  uVar5 = 0x76;
  pSVar2 = (SDL_RWops *)unaff_RBX;
LAB_001019db:
  do {
    rwops_error_quit(uVar5,pSVar2);
LAB_001019e3:
    uVar5 = 0x80;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_RWops *rwops = NULL;
	char test_buf[30];
	
	cleanup();

/* test 1 : basic argument test: all those calls to SDL_RWFromFile should fail */
	
	rwops = SDL_RWFromFile(NULL,NULL);
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(NULL,"ab+");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(NULL,"sldfkjsldkfj");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile("something","");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile("something",NULL);
	if (rwops) RWOP_ERR_QUIT(rwops);	
	printf("test1 OK\n");

/* test 2 : check that inexistant file is not successfully opened/created when required */
/* modes : r, r+ implie that file MUST exist 
   modes : a, a+, w, w+ checks that it succeeds (file may not exists)
   
 */
	rwops = SDL_RWFromFile(FBASENAME2,"rb"); /* this file doesn't exist that call must fail */
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(FBASENAME2,"rb+"); /* this file doesn't exist that call must fail */
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(FBASENAME2,"wb");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"wb+");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"ab"); 
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"ab+");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	printf("test2 OK\n");

/* test 3 : creation, writing , reading, seeking, 
	        test : w mode, r mode, w+ mode
 */
	rwops = SDL_RWFromFile(FBASENAME1,"wb"); /* write only */	
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in write only mode */
	rwops->close(rwops);

	rwops = SDL_RWFromFile(FBASENAME1,"rb"); /* read mode, file must exists */
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	if (0!=rwops->write(rwops,test_buf,1,1))			RWOP_ERR_QUIT(rwops); /* readonly mode */
	rwops->close(rwops);

/* test 3: same with w+ mode */
	rwops = SDL_RWFromFile(FBASENAME1,"wb+"); /* write + read + truncation */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in read/write mode */
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test3 OK\n");

/* test 4: same in r+ mode */
	rwops = SDL_RWFromFile(FBASENAME1,"rb+"); /* write + read + file must exists, no truncation */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in read/write mode */
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test4 OK\n");

/* test5 : append mode */
	rwops = SDL_RWFromFile(FBASENAME1,"ab+"); /* write + read + append */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops); 	
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); 
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	
	if (20+27!=rwops->seek(rwops,-7,RW_SEEK_END))		RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	
	if (27!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);
	
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);
	if (3!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"123456789012345678901234567123",30))	
														RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test5 OK\n");
	cleanup();
	return 0; /* all ok */
}